

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panic.c
# Opt level: O0

void aura_print_stacktrace(void)

{
  int iVar1;
  void *__ptr;
  ulong local_140;
  size_t i;
  char **strings;
  size_t size;
  void *array [36];
  
  iVar1 = backtrace(&size,0x24);
  __ptr = (void *)backtrace_symbols(&size,iVar1);
  slog(0,4,"--- Dumping aura stack (%d entries) ---",(long)iVar1);
  for (local_140 = 0; local_140 < (ulong)(long)iVar1; local_140 = local_140 + 1) {
    slog(0,4,"%s",*(undefined8 *)((long)__ptr + local_140 * 8));
  }
  free(__ptr);
  return;
}

Assistant:

void aura_print_stacktrace()
{
	void *array[TRACE_LEN];
	size_t size;
	char **strings;
	size_t i;

	size = backtrace(array, TRACE_LEN);
	strings = backtrace_symbols(array, size);

	slog(0, SLOG_DEBUG, "--- Dumping aura stack (%d entries) ---", size);
	for (i = 0; i < size; i++)
		slog(0, SLOG_DEBUG, "%s", strings[i]);

	free(strings);
}